

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

void __thiscall LiteScript::Class::AddUnstatic(Class *this,char *name,Variable *v)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  *this_00;
  pointer ppVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  allocator local_91;
  Variable local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_60;
  
  this_00 = &this->us_members;
  uVar3 = ((long)(this->us_members).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->us_members).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  bVar5 = (uVar3 & 0xffffffff) != 0;
  if (bVar5) {
    iVar2 = std::__cxx11::string::compare
                      ((char *)(this_00->
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar2 == 0) {
      uVar4 = 0;
    }
    else {
      uVar3 = uVar3 & 0xffffffff;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        if (uVar4 == uVar3) goto LAB_0013eb56;
        iVar2 = std::__cxx11::string::compare
                          ((char *)((this_00->
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar4));
      } while (iVar2 != 0);
      bVar5 = uVar4 < uVar3;
    }
    ppVar1 = (this_00->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_80,name,&local_91);
    Variable::Variable(&local_90,v);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
              (&local_60,&local_80,&local_90);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
    ::_M_insert_rval(this_00,ppVar1 + uVar4,&local_60);
    Variable::~Variable(&local_60.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p);
    }
    Variable::~Variable(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (bVar5) {
      return;
    }
  }
LAB_0013eb56:
  std::__cxx11::string::string((string *)&local_80,name,&local_91);
  Variable::Variable(&local_90,v);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
            (&local_60,&local_80,&local_90);
  std::
  vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
  ::emplace_back<std::pair<std::__cxx11::string,LiteScript::Variable>>
            ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
              *)this_00,&local_60);
  Variable::~Variable(&local_60.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  Variable::~Variable(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LiteScript::Class::AddUnstatic(const char *name, const Variable &v) {
    for (unsigned int i = 0, sz = this->us_members.size(); i < sz; i++) {
        if (this->us_members[i].first == name) {
            this->us_members.emplace(this->us_members.begin() + i, std::pair<std::string, Variable>({ std::string(name), Variable(v) }));
            return;
        }
    }
    this->us_members.push_back({ std::string(name), Variable(v) });
}